

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<std::__cxx11::string,char_const(&)[30]>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [30])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1110;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1110);
  inner::join_helper<std::__cxx11::string,char_const(&)[30]>
            (&local_1110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [30])ts);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1110);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1110);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}